

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clothModel.h
# Opt level: O0

void __thiscall embree::collide2::ClothModel::clearCollisionConstraints(ClothModel *this)

{
  bool bVar1;
  reference ppCVar2;
  __normal_iterator<embree::collide2::Constraint_**,_std::vector<embree::collide2::Constraint_*,_std::allocator<embree::collide2::Constraint_*>_>_>
  *in_RDI;
  Constraint *c;
  iterator __end2;
  iterator __begin2;
  vector<embree::collide2::Constraint_*,_std::allocator<embree::collide2::Constraint_*>_> *__range2;
  Constraint *in_stack_ffffffffffffffc8;
  __normal_iterator<embree::collide2::Constraint_**,_std::vector<embree::collide2::Constraint_*,_std::allocator<embree::collide2::Constraint_*>_>_>
  local_18;
  __normal_iterator<embree::collide2::Constraint_**,_std::vector<embree::collide2::Constraint_*,_std::allocator<embree::collide2::Constraint_*>_>_>
  *local_10;
  
  local_10 = in_RDI + 0x1f;
  local_18._M_current =
       (Constraint **)
       std::vector<embree::collide2::Constraint_*,_std::allocator<embree::collide2::Constraint_*>_>
       ::begin((vector<embree::collide2::Constraint_*,_std::allocator<embree::collide2::Constraint_*>_>
                *)in_stack_ffffffffffffffc8);
  std::vector<embree::collide2::Constraint_*,_std::allocator<embree::collide2::Constraint_*>_>::end
            ((vector<embree::collide2::Constraint_*,_std::allocator<embree::collide2::Constraint_*>_>
              *)in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<embree::collide2::Constraint_**,_std::vector<embree::collide2::Constraint_*,_std::allocator<embree::collide2::Constraint_*>_>_>
                               *)in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    ppCVar2 = __gnu_cxx::
              __normal_iterator<embree::collide2::Constraint_**,_std::vector<embree::collide2::Constraint_*,_std::allocator<embree::collide2::Constraint_*>_>_>
              ::operator*(&local_18);
    in_stack_ffffffffffffffc8 = *ppCVar2;
    if (in_stack_ffffffffffffffc8 != (Constraint *)0x0) {
      (*in_stack_ffffffffffffffc8->_vptr_Constraint[1])();
    }
    __gnu_cxx::
    __normal_iterator<embree::collide2::Constraint_**,_std::vector<embree::collide2::Constraint_*,_std::allocator<embree::collide2::Constraint_*>_>_>
    ::operator++(&local_18);
  }
  std::vector<embree::collide2::Constraint_*,_std::allocator<embree::collide2::Constraint_*>_>::
  clear((vector<embree::collide2::Constraint_*,_std::allocator<embree::collide2::Constraint_*>_> *)
        0x148a2b);
  return;
}

Assistant:

void clearCollisionConstraints()
    {
      for (auto c : c_constraints_) {
        delete c;
      }
      c_constraints_.clear ();
    }